

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ForkBranch<capnproto_test::capnp::test::TestInterface::Client>::get
          (ForkBranch<capnproto_test::capnp::test::TestInterface::Client> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<capnproto_test::capnp::test::TestInterface::Client> *pEVar1;
  Client local_40;
  Client *local_28;
  Client *value;
  ExceptionOr<capnproto_test::capnp::test::TestInterface::Client> *hubResult;
  ExceptionOrValue *output_local;
  ForkBranch<capnproto_test::capnp::test::TestInterface::Client> *this_local;
  
  hubResult = (ExceptionOr<capnproto_test::capnp::test::TestInterface::Client> *)output;
  output_local = (ExceptionOrValue *)this;
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  value = (Client *)
          ExceptionOrValue::as<capnproto_test::capnp::test::TestInterface::Client>(this_00);
  local_28 = readMaybe<capnproto_test::capnp::test::TestInterface::Client>
                       (&((ExceptionOr<capnproto_test::capnp::test::TestInterface::Client> *)value)
                         ->value);
  if (local_28 == (Client *)0x0) {
    pEVar1 = ExceptionOrValue::as<capnproto_test::capnp::test::TestInterface::Client>
                       (&hubResult->super_ExceptionOrValue);
    Maybe<capnproto_test::capnp::test::TestInterface::Client>::operator=(&pEVar1->value,(void *)0x0)
    ;
  }
  else {
    copyOrAddRef<capnproto_test::capnp::test::TestInterface::Client>(&local_40,local_28);
    pEVar1 = ExceptionOrValue::as<capnproto_test::capnp::test::TestInterface::Client>
                       (&hubResult->super_ExceptionOrValue);
    Maybe<capnproto_test::capnp::test::TestInterface::Client>::operator=(&pEVar1->value,&local_40);
    capnproto_test::capnp::test::TestInterface::Client::~Client(&local_40);
  }
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)hubResult,(Maybe<kj::Exception> *)value);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,&hubResult->super_ExceptionOrValue);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }